

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

reference<mpt::layout::text> * __thiscall
mpt::reference<mpt::layout::text>::operator=
          (reference<mpt::layout::text> *this,reference<mpt::layout::text> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  text *ptVar2;
  text *ptVar3;
  
  ptVar3 = ref->_ref;
  ptVar2 = this->_ref;
  if (ptVar3 != ptVar2) {
    if (ptVar3 == (text *)0x0) {
      ptVar3 = (text *)0x0;
    }
    else {
      iVar1 = (*(ptVar3->super_metatype).super_convertable._vptr_convertable[2])(ptVar3);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        ptVar3 = (text *)0x0;
      }
      ptVar2 = this->_ref;
    }
    if (ptVar2 != (text *)0x0) {
      (*(ptVar2->super_metatype).super_convertable._vptr_convertable[1])();
    }
    this->_ref = ptVar3;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}